

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::rc::Texture2DArray::sample4
          (Texture2DArray *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  undefined8 uVar1;
  tcu *ptVar2;
  tcu *ptVar3;
  float *pfVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  Vec3 dFdy1;
  tcu local_70 [12];
  tcu local_64 [12];
  tcu local_58 [12];
  undefined1 local_4c [28];
  
  if ((this->m_view).m_numLevels < 1) {
    fVar8 = 0.0;
    fVar9 = 0.0;
  }
  else {
    uVar1 = *(undefined8 *)(((this->m_view).m_levels)->m_size).m_data;
    fVar8 = (float)(int)uVar1;
    fVar9 = (float)(int)((ulong)uVar1 >> 0x20);
  }
  tcu::operator-(local_58,packetTexcoords + 1,packetTexcoords);
  tcu::operator-(local_64,packetTexcoords + 3,packetTexcoords + 2);
  tcu::operator-(local_70,packetTexcoords + 2,packetTexcoords);
  tcu::operator-((tcu *)(local_4c + 0x10),packetTexcoords + 3,packetTexcoords + 1);
  pfVar4 = packetTexcoords->m_data + 2;
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    ptVar2 = local_64;
    if (uVar5 < 2) {
      ptVar2 = local_58;
    }
    ptVar3 = (tcu *)(local_4c + 0x10);
    if ((uVar5 & 1) == 0) {
      ptVar3 = local_70;
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)ptVar2;
    auVar10._0_8_ = *(ulong *)ptVar2 ^ 0x8000000080000000;
    auVar10._8_4_ = 0x80000000;
    auVar10._12_4_ = 0x80000000;
    auVar11 = maxps(auVar10,auVar11);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)ptVar3;
    auVar12._0_8_ = *(ulong *)ptVar3 ^ 0x8000000080000000;
    auVar12._8_4_ = 0x80000000;
    auVar12._12_4_ = 0x80000000;
    auVar13 = maxps(auVar12,auVar13);
    uVar6 = -(uint)(auVar13._0_4_ <= auVar11._0_4_);
    uVar7 = -(uint)(auVar13._4_4_ <= auVar11._4_4_);
    fVar14 = (float)(~uVar6 & (uint)auVar13._0_4_ | (uint)auVar11._0_4_ & uVar6) * fVar8;
    fVar15 = (float)(~uVar7 & (uint)auVar13._4_4_ | (uint)auVar11._4_4_ & uVar7) * fVar9;
    uVar6 = -(uint)(fVar15 <= fVar14);
    fVar14 = deFloatLog2((float)(~uVar6 & (uint)fVar15 | (uint)fVar14 & uVar6));
    sample((Texture2DArray *)local_4c,((Vec3 *)(pfVar4 + -2))->m_data[0],pfVar4[-1],*pfVar4,
           fVar14 + lodBias);
    *(undefined8 *)output->m_data = local_4c._0_8_;
    *(undefined8 *)(output->m_data + 2) = local_4c._8_8_;
    output = output + 1;
    pfVar4 = pfVar4 + 3;
  }
  return;
}

Assistant:

void Texture2DArray::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}